

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O2

string * __thiscall
FIX::CheckSumConvertor::convert_abi_cxx11_
          (string *__return_storage_ptr__,CheckSumConvertor *this,int value)

{
  FieldConvertError *this_00;
  undefined4 in_register_00000014;
  allocator<char> local_39;
  string local_38;
  
  if ((uint)this < 0x100) {
    integer_to_string_padded<int>((__return_storage_ptr__->field_2)._M_local_buf,3,(uint)this,'0');
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 3;
    (__return_storage_ptr__->field_2)._M_local_buf[3] = '\0';
    return __return_storage_ptr__;
  }
  this_00 = (FieldConvertError *)
            __cxa_allocate_exception(0x50,this,CONCAT44(in_register_00000014,value));
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  FieldConvertError::FieldConvertError(this_00,&local_38);
  __cxa_throw(this_00,&FieldConvertError::typeinfo,Exception::~Exception);
}

Assistant:

EXCEPT(FieldConvertError) {
    if (value > 255 || value < 0) {
      throw FieldConvertError();
    }
    char result[3];
    integer_to_string_padded(result, sizeof(result), value);
    return std::string(result, sizeof(result));
  }